

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O0

void __thiscall flyd_connection_s::PutOneToFree(flyd_connection_s *this)

{
  CMemory *in_RDI;
  void *in_stack_ffffffffffffffe8;
  
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
  if (*(long *)(in_RDI + 0x98) != 0) {
    CMemory::GetInstance();
    CMemory::FreeMemory(in_RDI,in_stack_ffffffffffffffe8);
    *(undefined8 *)(in_RDI + 0x98) = 0;
  }
  if (*(long *)(in_RDI + 0xe8) != 0) {
    CMemory::GetInstance();
    CMemory::FreeMemory(in_RDI,in_stack_ffffffffffffffe8);
    *(undefined8 *)(in_RDI + 0xe8) = 0;
  }
  muduo::detail::AtomicIntegerT<int>::getAndSet((AtomicIntegerT<int> *)(in_RDI + 0xe0),0);
  return;
}

Assistant:

void flyd_connection_s::PutOneToFree()
{
    ++iCurrsequence;   
    if(precvMemPointer != NULL)//我们曾经给这个连接分配过接收数据的内存，则要释放内存
    {        
        CMemory::GetInstance()->FreeMemory(precvMemPointer);
        precvMemPointer = NULL;        
    }
    if(psendMemPointer != NULL) //如果发送数据的缓冲区里有内容，则要释放内存
    {
        CMemory::GetInstance()->FreeMemory(psendMemPointer);
        psendMemPointer = NULL;
    }

    iThrowsendCount.getAndSet(0);                              //设置不设置感觉都行         
}